

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiler.cpp
# Opt level: O0

void indk::Profiler::doAttachCallback(NeuralNet *object,int flag,ProfilerCallback *callback)

{
  pair<std::function<void_(indk::NeuralNet_*)>,_int> local_78;
  pair<indk::NeuralNet_*,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_> local_50;
  ProfilerCallback *local_20;
  ProfilerCallback *callback_local;
  NeuralNet *pNStack_10;
  int flag_local;
  NeuralNet *object_local;
  
  local_20 = callback;
  callback_local._4_4_ = flag;
  pNStack_10 = object;
  std::make_pair<std::function<void(indk::NeuralNet*)>&,int&>
            (&local_78,callback,(int *)((long)&callback_local + 4));
  std::make_pair<indk::NeuralNet*&,std::pair<std::function<void(indk::NeuralNet*)>,int>>
            (&local_50,&stack0xfffffffffffffff0,&local_78);
  std::
  multimap<indk::NeuralNet*,std::pair<std::function<void(indk::NeuralNet*)>,int>,std::less<indk::NeuralNet*>,std::allocator<std::pair<indk::NeuralNet*const,std::pair<std::function<void(indk::NeuralNet*)>,int>>>>
  ::insert<std::pair<indk::NeuralNet*,std::pair<std::function<void(indk::NeuralNet*)>,int>>>
            ((multimap<indk::NeuralNet*,std::pair<std::function<void(indk::NeuralNet*)>,int>,std::less<indk::NeuralNet*>,std::allocator<std::pair<indk::NeuralNet*const,std::pair<std::function<void(indk::NeuralNet*)>,int>>>>
              *)&Callbacks,&local_50);
  std::pair<indk::NeuralNet_*,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_>::~pair
            (&local_50);
  std::pair<std::function<void_(indk::NeuralNet_*)>,_int>::~pair(&local_78);
  return;
}

Assistant:

void indk::Profiler::doAttachCallback(indk::NeuralNet *object, int flag, indk::ProfilerCallback callback) {
    Callbacks.insert(std::make_pair(object, std::make_pair(callback, flag)));
}